

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2measures.cc
# Opt level: O3

double S2::TurnAngle(S2Point *a,S2Point *b,S2Point *c)

{
  FloatType FVar1;
  int iVar2;
  undefined4 local_68;
  uint uStack_64;
  Vector3_d local_58;
  Vector3_d local_40;
  
  RobustCrossProd(&local_40,a,b);
  RobustCrossProd(&local_58,b,c);
  FVar1 = Vector3<double>::Angle(&local_40,&local_58);
  iVar2 = s2pred::Sign(a,b,c);
  local_68 = SUB84(FVar1,0);
  uStack_64 = (uint)((ulong)FVar1 >> 0x20);
  if (iVar2 < 1) {
    uStack_64 = uStack_64 ^ 0x80000000;
  }
  return (double)CONCAT44(uStack_64,local_68);
}

Assistant:

double TurnAngle(const S2Point& a, const S2Point& b, const S2Point& c) {
  // We use RobustCrossProd() to get good accuracy when two points are very
  // close together, and Sign() to ensure that the sign is correct for
  // turns that are close to 180 degrees.
  //
  // Unfortunately we can't save RobustCrossProd(a, b) and pass it as the
  // optional 4th argument to Sign(), because Sign() requires a.CrossProd(b)
  // exactly (the robust version differs in magnitude).
  double angle = RobustCrossProd(a, b).Angle(RobustCrossProd(b, c));

  // Don't return Sign() * angle because it is legal to have (a == c).
  return (s2pred::Sign(a, b, c) > 0) ? angle : -angle;
}